

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

void __thiscall kj::ExceptionImpl::~ExceptionImpl(ExceptionImpl *this)

{
  ~ExceptionImpl(this);
  operator_delete(this,0x178);
  return;
}

Assistant:

ExceptionImpl(const ExceptionImpl& other): Exception(other) {
    // No need to copy whatBuffer since it's just to hold the return value of what().
  }